

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::MemberAccessExpressionSyntax::setChild
          (MemberAccessExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->name).kind = TVar2.kind;
    (this->name).field_0x2 = TVar2._2_1_;
    (this->name).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->name).rawLen = TVar2.rawLen;
    (this->name).info = TVar2.info;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->dot).kind = TVar2.kind;
    (this->dot).field_0x2 = TVar2._2_1_;
    (this->dot).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->dot).rawLen = TVar2.rawLen;
    (this->dot).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->left).ptr = (ExpressionSyntax *)pSVar1;
  }
  return;
}

Assistant:

void MemberAccessExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: dot = child.token(); return;
        case 2: name = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}